

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void reportLpRowVectors(HighsLogOptions *log_options,HighsLp *lp)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  allocator local_99;
  pointer local_98;
  pointer local_90;
  vector<int,_std::allocator<int>_> count;
  string type;
  string name;
  
  if (0 < (long)lp->num_row_) {
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    type.field_2._M_local_buf[0] = '\0';
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_90 = (lp->row_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_98 = (lp->row_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    name._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&count,(long)lp->num_row_,(value_type_conflict2 *)&name);
    iVar4 = lp->num_col_;
    if (0 < iVar4) {
      piVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar3 = 0; lVar3 < piVar1[iVar4]; lVar3 = lVar3 + 1) {
        count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [piVar2[lVar3]] =
             count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar2[lVar3]] + 1;
        iVar4 = lp->num_col_;
      }
    }
    highsLogUser(log_options,kInfo,"     Row        Lower        Upper       Type        Count");
    if (local_98 != local_90) {
      highsLogUser(log_options,kInfo,"  Name");
    }
    highsLogUser(log_options,kInfo,"\n");
    lVar3 = 0;
    for (uVar5 = 0; (long)uVar5 < (long)lp->num_row_; uVar5 = uVar5 + 1) {
      getBoundType_abi_cxx11_
                (&name,*(double *)
                        ((long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3),
                 *(double *)
                  ((long)(lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar3));
      std::__cxx11::string::operator=((string *)&type,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"",&local_99);
      highsLogUser(log_options,kInfo,"%8d %12g %12g         %2s %12d",
                   (int)*(undefined8 *)
                         ((long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar3),
                   *(undefined8 *)
                    ((long)(lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar3),uVar5 & 0xffffffff,
                   type._M_dataplus._M_p,
                   (ulong)(uint)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar5]);
      if (local_98 != local_90) {
        highsLogUser(log_options,kInfo,"  %-s",
                     *(undefined8 *)
                      ((long)&(((lp->row_names_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar3 * 4));
      }
      highsLogUser(log_options,kInfo,"\n");
      std::__cxx11::string::~string((string *)&name);
      lVar3 = lVar3 + 8;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&count.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::~string((string *)&type);
  }
  return;
}

Assistant:

void reportLpRowVectors(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_row_ <= 0) return;
  std::string type;
  vector<HighsInt> count;
  bool have_row_names = (lp.row_names_.size() != 0);

  count.resize(lp.num_row_, 0);
  if (lp.num_col_ > 0) {
    for (HighsInt el = 0; el < lp.a_matrix_.start_[lp.num_col_]; el++)
      count[lp.a_matrix_.index_[el]]++;
  }

  highsLogUser(log_options, HighsLogType::kInfo,
               "     Row        Lower        Upper       Type        Count");
  if (have_row_names) highsLogUser(log_options, HighsLogType::kInfo, "  Name");
  highsLogUser(log_options, HighsLogType::kInfo, "\n");

  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    type = getBoundType(lp.row_lower_[iRow], lp.row_upper_[iRow]);
    std::string name = "";
    highsLogUser(log_options, HighsLogType::kInfo,
                 "%8" HIGHSINT_FORMAT
                 " %12g %12g         %2s %12" HIGHSINT_FORMAT "",
                 iRow, lp.row_lower_[iRow], lp.row_upper_[iRow], type.c_str(),
                 count[iRow]);
    if (have_row_names)
      highsLogUser(log_options, HighsLogType::kInfo, "  %-s",
                   lp.row_names_[iRow].c_str());
    highsLogUser(log_options, HighsLogType::kInfo, "\n");
  }
}